

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.hpp
# Opt level: O1

bool __thiscall csv::CSVField::operator==(CSVField *this,char *other)

{
  size_t __n;
  char *__s1;
  int iVar1;
  size_t sVar2;
  size_type __rlen;
  bool bVar3;
  
  __n = (this->sv)._M_len;
  __s1 = (this->sv)._M_str;
  sVar2 = strlen(other);
  if (__n == sVar2) {
    if (__n == 0) {
      bVar3 = true;
    }
    else {
      iVar1 = bcmp(__s1,other,__n);
      bVar3 = iVar1 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

CONSTEXPR bool CSVField::operator==(const char * other) const noexcept
    {
        return this->sv == other;
    }